

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

char ** lys_features_list(lys_module *module,uint8_t **states)

{
  lys_feature *plVar1;
  char **__ptr;
  uint8_t *puVar2;
  ulong uVar3;
  LY_ERR *pLVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  lys_submodule *plVar8;
  uint uVar9;
  
  if (module == (lys_module *)0x0) {
LAB_0015a623:
    __ptr = (char **)0x0;
  }
  else {
    uVar9 = (uint)module->features_size;
    if (module->inc_size != 0) {
      lVar6 = 0;
      do {
        uVar9 = uVar9 + *(byte *)(*(long *)(module->inc->rev + lVar6 + -8) + 0x47);
        lVar6 = lVar6 + 0x30;
      } while ((ulong)module->inc_size * 0x30 != lVar6);
    }
    __ptr = (char **)malloc((ulong)(uVar9 + 1) * 8);
    if (__ptr == (char **)0x0) {
      pLVar4 = ly_errno_location();
      *pLVar4 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_features_list");
      return (char **)0x0;
    }
    if (states != (uint8_t **)0x0) {
      puVar2 = (uint8_t *)malloc((ulong)(uVar9 + 1));
      *states = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_features_list");
        free(__ptr);
        goto LAB_0015a623;
      }
    }
    if (module->features_size == '\0') {
      uVar3 = 0;
    }
    else {
      lVar6 = 0;
      uVar3 = 0;
      do {
        plVar1 = module->features;
        __ptr[uVar3] = *(char **)(plVar1->padding + lVar6 + -0x1c);
        if (states != (uint8_t **)0x0) {
          (*states)[uVar3] = plVar1->padding[lVar6 + -3] & 1;
        }
        uVar3 = uVar3 + 1;
        lVar6 = lVar6 + 0x40;
      } while (uVar3 < module->features_size);
    }
    uVar9 = (uint)uVar3;
    if (module->inc_size != '\0') {
      uVar5 = 0;
      do {
        plVar8 = module->inc[uVar5].submodule;
        if (plVar8->features_size != '\0') {
          lVar6 = 0;
          uVar7 = 0;
          do {
            uVar9 = (int)uVar3 + (int)uVar7;
            plVar1 = plVar8->features;
            __ptr[uVar9] = *(char **)(plVar1->padding + lVar6 + -0x1c);
            if (states != (uint8_t **)0x0) {
              (*states)[uVar9] = plVar1->padding[lVar6 + -3] & 1;
            }
            uVar7 = uVar7 + 1;
            plVar8 = module->inc[uVar5].submodule;
            lVar6 = lVar6 + 0x40;
          } while (uVar7 < plVar8->features_size);
          uVar3 = (ulong)(uint)((int)uVar3 + (int)uVar7);
        }
        uVar9 = (uint)uVar3;
        uVar5 = uVar5 + 1;
      } while (uVar5 < module->inc_size);
    }
    __ptr[uVar9] = (char *)0x0;
  }
  return __ptr;
}

Assistant:

API const char **
lys_features_list(const struct lys_module *module, uint8_t **states)
{
    const char **result = NULL;
    int i, j;
    unsigned int count;

    if (!module) {
        return NULL;
    }

    count = module->features_size;
    for (i = 0; i < module->inc_size; i++) {
        count += module->inc[i].submodule->features_size;
    }
    result = malloc((count + 1) * sizeof *result);
    if (!result) {
        LOGMEM;
        return NULL;
    }
    if (states) {
        *states = malloc((count + 1) * sizeof **states);
        if (!(*states)) {
            LOGMEM;
            free(result);
            return NULL;
        }
    }
    count = 0;

    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        result[count] = module->features[i].name;
        if (states) {
            if (module->features[i].flags & LYS_FENABLED) {
                (*states)[count] = 1;
            } else {
                (*states)[count] = 0;
            }
        }
        count++;
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            result[count] = module->inc[j].submodule->features[i].name;
            if (states) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    (*states)[count] = 1;
                } else {
                    (*states)[count] = 0;
                }
            }
            count++;
        }
    }

    /* terminating NULL byte */
    result[count] = NULL;

    return result;
}